

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O3

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  json_index_t jVar2;
  jsonChildren *pjVar3;
  uint uVar4;
  JSONNode **ppJVar5;
  uint uVar6;
  uint uVar7;
  size_t count;
  json_string jStack_48;
  
  pjVar3 = *mine;
  if (pjVar3->array == (JSONNode **)0x0) {
    paVar1 = &jStack_48.field_2;
    jStack_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&jStack_48,"Children is null reserve","");
    JSONDebug::_JSON_ASSERT(true,&jStack_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jStack_48._M_dataplus._M_p != paVar1) {
      operator_delete(jStack_48._M_dataplus._M_p);
    }
    ppJVar5 = pjVar3->array;
    jStack_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&jStack_48,"reserve is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(ppJVar5 == (JSONNode **)0x0,&jStack_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jStack_48._M_dataplus._M_p != paVar1) {
      operator_delete(jStack_48._M_dataplus._M_p);
    }
    jVar2 = pjVar3->mycapacity;
    jStack_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&jStack_48,"reservec is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(jVar2 == 0,&jStack_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jStack_48._M_dataplus._M_p != paVar1) {
      operator_delete(jStack_48._M_dataplus._M_p);
    }
    jVar2 = pjVar3->mysize;
    jStack_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&jStack_48,"reserves is not meant to expand a preexisting array","");
    JSONDebug::_JSON_ASSERT(jVar2 == 0,&jStack_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jStack_48._M_dataplus._M_p != paVar1) {
      operator_delete(jStack_48._M_dataplus._M_p);
    }
    pjVar3->mycapacity = amount;
    ppJVar5 = (JSONNode **)malloc((ulong)amount << 3);
    jStack_48.field_2._M_allocated_capacity._0_5_ = 0x6f2074754f;
    jStack_48.field_2._M_allocated_capacity._5_3_ = 0x6d2066;
    jStack_48.field_2._8_5_ = 0x79726f6d65;
    jStack_48._M_string_length = 0xd;
    jStack_48.field_2._M_local_buf[0xd] = '\0';
    jStack_48._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(ppJVar5 != (JSONNode **)0x0,&jStack_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jStack_48._M_dataplus._M_p != paVar1) {
      operator_delete(jStack_48._M_dataplus._M_p);
    }
    pjVar3->array = ppJVar5;
    return;
  }
  uVar7 = amount - pjVar3->mycapacity;
  if (amount < pjVar3->mycapacity || uVar7 == 0) {
    return;
  }
  paVar1 = &jStack_48.field_2;
  jStack_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&jStack_48,"Children is null inc(amount)","");
  JSONDebug::_JSON_ASSERT(true,&jStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)jStack_48._M_dataplus._M_p != paVar1) {
    operator_delete(jStack_48._M_dataplus._M_p);
  }
  if (uVar7 != 0) {
    uVar6 = pjVar3->mysize + uVar7;
    uVar4 = pjVar3->mycapacity;
    if (uVar4 <= uVar6) {
      if (uVar4 == 0) {
        ppJVar5 = pjVar3->array;
        jStack_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&jStack_48,"Expanding a 0 capacity array, but not null","");
        JSONDebug::_JSON_ASSERT(ppJVar5 == (JSONNode **)0x0,&jStack_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)jStack_48._M_dataplus._M_p != paVar1) {
          operator_delete(jStack_48._M_dataplus._M_p);
        }
        count = 8;
        if (8 < uVar7) {
          count = (size_t)uVar7;
        }
        ppJVar5 = json_malloc<JSONNode*>(count);
        pjVar3->array = ppJVar5;
        pjVar3->mycapacity = (json_index_t)count;
      }
      else {
        if (uVar4 < uVar6) {
          do {
            uVar4 = uVar4 * 2;
          } while (uVar4 < uVar6);
          pjVar3->mycapacity = uVar4;
        }
        ppJVar5 = (JSONNode **)realloc(pjVar3->array,(ulong)uVar4 << 3);
        jStack_48.field_2._M_allocated_capacity._0_5_ = 0x6f2074754f;
        jStack_48.field_2._M_allocated_capacity._5_3_ = 0x6d2066;
        jStack_48.field_2._8_5_ = 0x79726f6d65;
        jStack_48._M_string_length = 0xd;
        jStack_48.field_2._M_local_buf[0xd] = '\0';
        jStack_48._M_dataplus._M_p = (pointer)paVar1;
        JSONDebug::_JSON_ASSERT(ppJVar5 != (JSONNode **)0x0,&jStack_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)jStack_48._M_dataplus._M_p != paVar1) {
          operator_delete(jStack_48._M_dataplus._M_p);
        }
        pjVar3->array = ppJVar5;
      }
    }
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}